

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O3

ostream * Libdbc::operator<<(ostream *out,Signal *sig)

{
  pointer pbVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reciever;
  pointer pbVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Signal {name: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(sig->name)._M_dataplus._M_p,(sig->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Multiplexed: ",0xd);
  pcVar3 = "False";
  if ((ulong)sig->is_multiplexed != 0) {
    pcVar3 = "True";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,(ulong)sig->is_multiplexed ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Start bit: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Size: ",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Endianness: ",0xc);
  pcVar3 = "Little endian";
  if ((ulong)sig->is_bigendian != 0) {
    pcVar3 = "Big endian";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,pcVar3,((ulong)sig->is_bigendian ^ 1) * 3 + 10);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Value Type: ",0xc);
  pcVar3 = "Unsigned";
  if (sig->is_signed != false) {
    pcVar3 = "Signed";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,(ulong)(sig->is_signed ^ 1) * 2 + 6)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Min: ",5);
  poVar2 = std::ostream::_M_insert<double>(sig->min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", Max: ",7);
  poVar2 = std::ostream::_M_insert<double>(sig->max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Unit: (",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(sig->unit)._M_dataplus._M_p,(sig->unit)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"receivers: ",0xb);
  pbVar1 = (sig->receivers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (sig->receivers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signal& sig) {
	out << "Signal {name: " << sig.name << ", ";
	out << "Multiplexed: " << (sig.is_multiplexed ? "True" : "False") << ", ";
	out << "Start bit: " << sig.start_bit << ", ";
	out << "Size: " << sig.size << ", ";
	out << "Endianness: " << (sig.is_bigendian ? "Big endian" : "Little endian") << ", ";
	out << "Value Type: " << (sig.is_signed ? "Signed" : "Unsigned") << ", ";
	out << "Min: " << sig.min << ", Max: " << sig.max << ", ";
	out << "Unit: (" << sig.unit << "), ";
	out << "receivers: ";
	for (const auto& reciever : sig.receivers) {
		out << reciever;
	}
	return out << "}";
}